

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceField.cpp
# Opt level: O2

ifstrstream * __thiscall OpenMD::ForceField::openForceFieldFile(ForceField *this,string *filename)

{
  bool bVar1;
  ifstrstream *this_00;
  string forceFieldFilename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string((string *)&forceFieldFilename,(string *)filename);
  this_00 = (ifstrstream *)operator_new(0x278);
  ifstrstream::ifstrstream(this_00);
  ifstrstream::open(this_00,forceFieldFilename._M_dataplus._M_p,8,0);
  bVar1 = ifstrstream::is_open(this_00);
  if (!bVar1) {
    std::operator+(&local_58,&this->ffPath_,"/");
    std::operator+(&local_38,&local_58,&forceFieldFilename);
    std::__cxx11::string::operator=((string *)&forceFieldFilename,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    ifstrstream::open(this_00,forceFieldFilename._M_dataplus._M_p,8,0);
    bVar1 = ifstrstream::is_open(this_00);
    if (!bVar1) {
      snprintf(painCave.errMsg,2000,
               "Error opening the force field parameter file:\n\t%s\n\tHave you tried setting the FORCE_PARAM_PATH environment variable?\n"
               ,forceFieldFilename._M_dataplus._M_p);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  std::__cxx11::string::~string((string *)&forceFieldFilename);
  return this_00;
}

Assistant:

ifstrstream* ForceField::openForceFieldFile(const std::string& filename) {
    std::string forceFieldFilename(filename);

    ifstrstream* ffStream = new ifstrstream();

    // Try to open the force field file in current directory first
    ffStream->open(forceFieldFilename.c_str());

    if (!ffStream->is_open()) {
      // If current directory does not contain the force field file,
      // try to open it in ffPath_:
      forceFieldFilename = ffPath_ + "/" + forceFieldFilename;
      ffStream->open(forceFieldFilename.c_str());

      if (!ffStream->is_open()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Error opening the force field parameter file:\n"
                 "\t%s\n"
                 "\tHave you tried setting the FORCE_PARAM_PATH environment "
                 "variable?\n",
                 forceFieldFilename.c_str());
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }
    }
    return ffStream;
  }